

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

bool __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
FixEqualityResult<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>,mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *c,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
          *prepro)

{
  bool bVar1;
  ConType *this_00;
  QuadAndLinTerms *in_RSI;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double dVar2;
  double dVar3;
  PreprocessInfoStd bndsNType;
  double rhs;
  QuadAndLinTerms *body;
  ConType *con;
  double in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  bool local_1;
  
  this_00 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
            ::GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                             *)0x264ef6);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetBody(this_00);
  dVar2 = AlgConRhs<0>::rhs(&this_00->super_AlgConRhs<0>);
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType(in_RDI,in_RSI);
  dVar3 = PreprocessInfo<int>::lb((PreprocessInfo<int> *)&stack0xffffffffffffffb0);
  if ((dVar2 < dVar3) ||
     (dVar3 = PreprocessInfo<int>::ub((PreprocessInfo<int> *)&stack0xffffffffffffffb0),
     dVar3 < dVar2)) {
    PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
    ::narrow_result_bounds
              ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_1 = true;
  }
  else {
    dVar3 = PreprocessInfo<int>::lb((PreprocessInfo<int> *)&stack0xffffffffffffffb0);
    if (dVar3 == dVar2) {
      dVar3 = PreprocessInfo<int>::ub((PreprocessInfo<int> *)&stack0xffffffffffffffb0);
      if ((dVar3 == dVar2) && (!NAN(dVar3) && !NAN(dVar2))) {
        PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
        ::narrow_result_bounds
                  ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        return true;
      }
    }
    if (in_stack_ffffffffffffffc0 == INTEGER) {
      AlgConRhs<0>::rhs(&this_00->super_AlgConRhs<0>);
      bVar1 = is_integer<double>(in_stack_ffffffffffffffb0);
      if (!bVar1) {
        PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
        ::narrow_result_bounds
                  ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FixEqualityResult(
      CondAlgCon& c, PreprocessInfo& prepro) {
    const auto& con = c.GetConstraint();
    const auto& body = con.GetBody();
    const auto rhs = con.rhs();
    auto bndsNType = MPD( ComputeBoundsAndType(body) );
    if (bndsNType.lb() > rhs || bndsNType.ub() < rhs) {
      prepro.narrow_result_bounds(0.0, 0.0);
      return true;
    }
    if (bndsNType.lb()==rhs && bndsNType.ub()==rhs) {
      prepro.narrow_result_bounds(1.0, 1.0);
      return true;
    }
    if (var::INTEGER==bndsNType.type_ &&
        !is_integer(con.rhs())) {
      prepro.narrow_result_bounds(0.0, 0.0);
      return true;
    }
    return false;
  }